

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenerateStaticConstructor
          (KotlinGenerator *this,StructDef *struct_def,CodeWriter *code,IDLOptions *options)

{
  anon_class_24_3_05e67fb7 local_150;
  function<void_()> local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  string params;
  IDLOptions *options_local;
  CodeWriter *code_local;
  StructDef *struct_def_local;
  KotlinGenerator *this_local;
  
  params.field_2._8_8_ = options;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_69);
  StructConstructorParams((string *)local_48,this,struct_def,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"create",&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_e9);
  IdlNamer::LegacyJavaMethod2(&local_a0,&this->namer_,&local_c0,struct_def,&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"Int",&local_111);
  local_150.this = this;
  local_150.struct_def = struct_def;
  local_150.code = code;
  std::function<void()>::
  function<flatbuffers::kotlin::KotlinGenerator::GenerateStaticConstructor(flatbuffers::StructDef_const&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_1_,void>
            ((function<void()> *)&local_138,&local_150);
  GenerateFun(code,&local_a0,(string *)local_48,&local_110,&local_138,
              (bool)(options->gen_jvmstatic & 1));
  std::function<void_()>::~function(&local_138);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void GenerateStaticConstructor(const StructDef &struct_def, CodeWriter &code,
                                 const IDLOptions options) const {
    // create a struct constructor function
    auto params = StructConstructorParams(struct_def);
    GenerateFun(
        code, namer_.LegacyJavaMethod2("create", struct_def, ""), params, "Int",
        [&]() {
          GenStructBody(struct_def, code, "");
          code += "return builder.offset()";
        },
        options.gen_jvmstatic);
  }